

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::IsStringInlined(FieldDescriptor *descriptor,Options *options)

{
  bool bVar1;
  Descriptor *this;
  Options *in_RSI;
  FieldDescriptor *in_RDI;
  bool local_1;
  
  if ((in_RSI->opensource_runtime & 1U) == 0) {
    FieldDescriptor::containing_type(in_RDI);
    bVar1 = IsAnyMessage((Descriptor *)in_RDI,in_RSI);
    if (bVar1) {
      local_1 = false;
    }
    else {
      this = FieldDescriptor::containing_type(in_RDI);
      Descriptor::options(this);
      bVar1 = MessageOptions::map_entry((MessageOptions *)0x43535e);
      if (bVar1) {
        local_1 = false;
      }
      else {
        FieldDescriptor::file(in_RDI);
        bVar1 = HasFieldPresence((FileDescriptor *)0x43537d);
        if (bVar1) {
          if ((in_RSI->access_info_map == (AccessInfoMap *)0x0) ||
             (bVar1 = FieldDescriptor::is_required((FieldDescriptor *)0x4353a0), !bVar1)) {
            local_1 = false;
          }
          else {
            local_1 = true;
          }
        }
        else {
          local_1 = false;
        }
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool IsStringInlined(const FieldDescriptor* descriptor,
                     const Options& options) {
  if (options.opensource_runtime) return false;

  // TODO(ckennelly): Handle inlining for any.proto.
  if (IsAnyMessage(descriptor->containing_type(), options)) return false;
  if (descriptor->containing_type()->options().map_entry()) return false;

  // Limit to proto2, as we rely on has bits to distinguish field presence for
  // release_$name$.  On proto3, we cannot use the address of the string
  // instance when the field has been inlined.
  if (!HasFieldPresence(descriptor->file())) return false;

  if (options.access_info_map) {
    if (descriptor->is_required()) return true;
  }
  return false;
}